

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

void readQuantizationTable(ifstream *inFile,Header *header)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  uint local_28;
  uint local_24;
  uint i_1;
  uint i;
  byte tableID;
  byte tableSize;
  byte tableInfo;
  int length;
  Header *header_local;
  ifstream *inFile_local;
  
  poVar6 = std::operator<<((ostream *)&std::cout,"Reading DQT");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  iVar3 = std::istream::get();
  iVar4 = std::istream::get();
  i = (iVar3 * 0x100 + iVar4) - 2;
  while( true ) {
    if ((int)i < 1) {
      if (i != 0) {
        std::operator<<((ostream *)&std::cout,"Error -DQT invalid\n");
        header->valid = false;
      }
      return;
    }
    bVar1 = std::istream::get();
    bVar2 = bVar1 & 0xf;
    if (3 < bVar2) break;
    header->quantizationTables[bVar2].set = true;
    if ((char)((int)(uint)bVar1 >> 4) == '\0') {
      for (local_28 = 0; local_28 < 0x40; local_28 = local_28 + 1) {
        uVar5 = std::istream::get();
        header->quantizationTables[bVar2].table[""[local_28]] = uVar5;
      }
      i = i - 0x41;
    }
    else {
      for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 1) {
        iVar3 = std::istream::get();
        iVar4 = std::istream::get();
        header->quantizationTables[bVar2].table[""[local_24]] = iVar3 * 0x100 + iVar4;
      }
      i = i - 0x81;
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"invaild quantizatio table ID:");
  poVar6 = std::operator<<(poVar6,bVar2);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  header->valid = false;
  return;
}

Assistant:

void readQuantizationTable(std::ifstream& inFile, Header* const header) {
	std::cout << "Reading DQT" << std::endl;
	int length = (inFile.get() << 8) + inFile.get();
	length = length - 2;
	while (length > 0) {	
		byte tableInfo = inFile.get();
		byte tableSize = tableInfo >> 4;
		byte tableID = tableInfo & 0x0F;
		length = length - 1;

		//只能是 0 1 2 3 
		if (tableID > 3) {
			std::cout << "invaild quantizatio table ID:" << tableID << std::endl;
			header->valid = false;
			return;
		}

		header->quantizationTables[tableID].set = true;

		if (tableSize != 0) { //2bytes
			for (uint i = 0; i < 64; i++) {
				//文件中的数据是以zig_zag的顺序存储的，所以需要以zig_zag的顺序赋值。
				header->quantizationTables[tableID].table[ZIG_ZAG[i]] = (inFile.get() << 8) + inFile.get();
			}
			length = length - 128;
		} else {
			for (uint i = 0; i < 64; i++) {
				header->quantizationTables[tableID].table[ZIG_ZAG[i]] = inFile.get();
			}
			length = length - 64;
		}
	}

	if (length != 0) {
		std::cout << "Error -DQT invalid\n";
		header->valid = false;
	}
}